

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> __thiscall
capnp::LocalClient::whenMoreResolved(LocalClient *this)

{
  PromiseArenaMember *node;
  ClientHook *pCVar1;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>_2
  extraout_RDX_02;
  long in_RSI;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> MVar2;
  void *continuationTracePtr;
  PromiseArenaMember *local_40;
  PromiseArena *local_38;
  ClientHook *local_30;
  code *local_20;
  
  if (*(long **)(in_RSI + 0x60) == (long *)0x0) {
    if (*(char *)(in_RSI + 0x40) == '\x01') {
      kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&stack0xffffffffffffffc0);
      local_20 = kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:672:33)>
                 ::anon_class_8_1_8991fb9c_for_func::operator();
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<void,capnp::LocalClient::whenMoreResolved()::_lambda()_1_>,kj::_::PromiseDisposer,capnp::LocalClient::whenMoreResolved()::_lambda()_1_,void*&>
                ((PromiseDisposer *)&(this->super_ClientHook).brand,
                 (OwnPromiseNode *)&stack0xffffffffffffffc0,
                 (anon_class_8_1_8991fb9c_for_func *)&stack0xffffffffffffffd8,
                 &stack0xffffffffffffffe0);
      node = local_40;
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
      in_RDX = extraout_RDX_01;
      if (local_40 != (PromiseArenaMember *)0x0) {
        local_40 = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose(node);
        in_RDX = extraout_RDX_02;
      }
    }
    else {
      *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 0;
    }
  }
  else {
    (**(code **)(**(long **)(in_RSI + 0x60) + 0x20))
              ((Own<capnp::ClientHook,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<capnp::ClientHook,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<capnp::ClientHook,decltype(nullptr)>>
              ((PromiseDisposer *)&(this->super_ClientHook).brand,
               (Own<capnp::ClientHook,_std::nullptr_t> *)&stack0xffffffffffffffc8);
    pCVar1 = local_30;
    *(undefined1 *)&(this->super_ClientHook)._vptr_ClientHook = 1;
    in_RDX = extraout_RDX;
    if (local_30 != (ClientHook *)0x0) {
      local_30 = (ClientHook *)0x0;
      (***(_func_int ***)local_38->bytes)
                (local_38,(_func_int *)
                          ((long)&pCVar1->_vptr_ClientHook + (long)pCVar1->_vptr_ClientHook[-2]));
      in_RDX = extraout_RDX_00;
    }
  }
  MVar2.ptr.field_1 = in_RDX;
  MVar2.ptr._0_8_ = this;
  return (Maybe<kj::Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>)MVar2.ptr;
}

Assistant:

kj::Maybe<kj::Promise<kj::Own<ClientHook>>> whenMoreResolved() override {
    KJ_IF_SOME(r, resolved) {
      return kj::Promise<kj::Own<ClientHook>>(r->addRef());
    } else KJ_IF_SOME(t, resolveTask) {
      return t.addBranch().then([this]() {
        return KJ_ASSERT_NONNULL(resolved)->addRef();
      });
    } else {
      return kj::none;
    }